

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesSchedulerSetComputeUnitDebugMode(zes_sched_handle_t hScheduler,ze_bool_t *pNeedReload)

{
  zes_pfnSchedulerSetComputeUnitDebugMode_t pfnSetComputeUnitDebugMode;
  ze_result_t result;
  ze_bool_t *pNeedReload_local;
  zes_sched_handle_t hScheduler_local;
  
  pfnSetComputeUnitDebugMode._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cbb0 != (code *)0x0) {
    pfnSetComputeUnitDebugMode._4_4_ = (*DAT_0011cbb0)(hScheduler,pNeedReload);
  }
  return pfnSetComputeUnitDebugMode._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesSchedulerSetComputeUnitDebugMode(
        zes_sched_handle_t hScheduler,                  ///< [in] Sysman handle for the component.
        ze_bool_t* pNeedReload                          ///< [in,out] Will be set to TRUE if a device driver reload is needed to
                                                        ///< apply the new scheduler mode.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetComputeUnitDebugMode = context.zesDdiTable.Scheduler.pfnSetComputeUnitDebugMode;
        if( nullptr != pfnSetComputeUnitDebugMode )
        {
            result = pfnSetComputeUnitDebugMode( hScheduler, pNeedReload );
        }
        else
        {
            // generic implementation
        }

        return result;
    }